

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplerBindingRenderCase::generateShaders
          (SamplerBindingRenderCase *this)

{
  string *name;
  ShaderType SVar1;
  RenderContext *renderCtx;
  DataType DVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  ShaderProgram *this_00;
  uint uVar6;
  long lVar7;
  int declNdx;
  ulong uVar8;
  string samplerType;
  string texCoordType;
  ostringstream shaderBody;
  ostringstream shaderUniformDecl;
  undefined4 local_5f0;
  undefined4 uStack_5ec;
  value_type local_5e8;
  string *local_5c8;
  string local_5c0;
  string local_5a0;
  long *local_580;
  long local_578;
  long local_570 [2];
  long *local_560;
  long local_558;
  long local_550 [2];
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  uint local_4c0;
  value_type local_4b8;
  undefined1 local_498 [112];
  ios_base local_428 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_408;
  undefined1 local_3e8 [200];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  DVar2 = TYPE_FLOAT_VEC2;
  if (this->m_samplerType != 0x8b5e) {
    DVar2 = (uint)(this->m_samplerType == 0x8b5f) * 3;
  }
  pcVar4 = glu::getDataTypeName(DVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,pcVar4,(allocator<char> *)local_498);
  DVar2 = glu::getDataTypeFromGLType(this->m_samplerType);
  pcVar4 = glu::getDataTypeName(DVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,pcVar4,(allocator<char> *)local_498);
  uVar6 = (this->super_LayoutBindingRenderCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar3 = 1;
  if (1 < uVar6) {
    uVar3 = (this->super_LayoutBindingRenderCase).m_numBindings;
  }
  if (0 < (int)uVar3) {
    name = &(this->super_LayoutBindingRenderCase).m_uniformName;
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(binding = ",0x11);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)local_1a8,
                          (this->super_LayoutBindingRenderCase).m_bindings.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") uniform highp ",0x10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_580,local_578);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      if (uVar6 < 2) {
        getUniformName((string *)local_498,name,(int)uVar8,
                       (this->super_LayoutBindingRenderCase).m_numBindings);
      }
      else {
        getUniformName((string *)local_498,name,(int)uVar8);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  if (0 < (this->super_LayoutBindingRenderCase).m_numBindings) {
    local_5c8 = &(this->super_LayoutBindingRenderCase).m_uniformName;
    declNdx = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t",1);
      pcVar4 = "else if";
      if (declNdx == 0) {
        pcVar4 = "if";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,pcVar4,(ulong)(declNdx != 0) * 5 + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," (u_arrayNdx == ",0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::ostream::operator<<((string *)local_498,declNdx);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,(char *)CONCAT44(uStack_5ec,local_5f0),
                          (long)local_5e8._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t{\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tcolor = texture(",0x12);
      if (uVar6 < 2) {
        getUniformName((string *)local_498,local_5c8,0,declNdx);
      }
      else {
        getUniformName((string *)local_498,local_5c8,declNdx);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_560,local_558);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(0.5));\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t}\n",3);
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      if ((size_type *)CONCAT44(uStack_5ec,local_5f0) != &local_5e8._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(uStack_5ec,local_5f0),local_5e8._M_string_length + 1)
        ;
      }
      declNdx = declNdx + 1;
    } while (declNdx < (this->super_LayoutBindingRenderCase).m_numBindings);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t}\n",3);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  local_3e8[0x10] = 0;
  local_3e8._17_8_ = 0;
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8[8] = 0;
  local_3e8._9_7_ = 0;
  memset(local_498,0,0xac);
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_5a0,SVar1,&local_4e0,&local_500);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e8,local_5a0._M_dataplus._M_p,
             local_5a0._M_dataplus._M_p + local_5a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_498,&local_5e8);
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_5c0,SVar1,&local_520,&local_540);
  local_4c0 = 1;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,local_5c0._M_dataplus._M_p,
             local_5c0._M_dataplus._M_p + local_5c0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + (ulong)local_4c0 * 0x18),&local_4b8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_408);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if (local_580 != local_570) {
    operator_delete(local_580,local_570[0] + 1);
  }
  if (local_560 != local_550) {
    operator_delete(local_560,local_550[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return this_00;
}

Assistant:

glu::ShaderProgram* SamplerBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;

	const std::string		texCoordType	= glu::getDataTypeName(getSamplerTexCoordType());
	const std::string		samplerType		= glu::getDataTypeName(glu::getDataTypeFromGLType(m_samplerType));
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY) ? true : false;
	const int				numDeclarations =  arrayInstance ? 1 : m_numBindings;

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(binding = " << m_bindings[declNdx] << ") uniform highp " << samplerType << " "
			<< (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings; ++bindNdx)
	{
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = texture(" << (arrayInstance ? getUniformName(m_uniformName, 0, bindNdx) : getUniformName(m_uniformName, bindNdx)) << ", " << texCoordType << "(0.5));\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}